

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

SCC * __thiscall google::protobuf::compiler::cpp::SCCAnalyzer::CreateSCC(SCCAnalyzer *this)

{
  pointer *pppSVar1;
  iterator __position;
  SCC *local_10;
  
  local_10 = (SCC *)operator_new(0x18);
  (local_10->descriptors).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_10->descriptors).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_10->descriptors).
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position._M_current =
       (this->garbage_bin_).
       super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->garbage_bin_).
      super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::compiler::cpp::SCC*,std::allocator<google::protobuf::compiler::cpp::SCC*>>
    ::_M_realloc_insert<google::protobuf::compiler::cpp::SCC*>
              ((vector<google::protobuf::compiler::cpp::SCC*,std::allocator<google::protobuf::compiler::cpp::SCC*>>
                *)&this->garbage_bin_,__position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    pppSVar1 = &(this->garbage_bin_).
                super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return (this->garbage_bin_).
         super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

SCC* CreateSCC() {
    garbage_bin_.push_back(new SCC());
    return garbage_bin_.back();
  }